

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_npn_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl_00;
  _func_int_SSL_ptr_uint8_t_ptr_ptr_uint8_t_ptr_uint8_t_ptr_uint_void_ptr *p_Var1;
  SSL3_STATE *pSVar2;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  pointer psVar6;
  uint8_t *puVar7;
  size_t sVar8;
  byte local_81;
  Span<unsigned_char> local_80;
  Span<const_unsigned_char> local_70;
  byte local_59;
  uchar *puStack_58;
  uint8_t selected_len;
  uint8_t *selected;
  CBS proto;
  size_t orig_len;
  uint8_t *orig_contents;
  SSL *ssl;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    uVar4 = ssl_protocol_version(ssl_00);
    if (uVar4 < 0x304) {
      if ((((byte)(*(ushort *)&ssl_00->s3->field_0xdc >> 4) & 1 ^ 0xff) & 1) == 0) {
        __assert_fail("!ssl->s3->initial_handshake_complete",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x483,
                      "bool bssl::ext_npn_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
      }
      iVar5 = SSL_is_dtls(ssl_00);
      if (iVar5 != 0) {
        __assert_fail("!SSL_is_dtls(ssl)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x484,
                      "bool bssl::ext_npn_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
      }
      psVar6 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl_00->ctx);
      if (psVar6->next_proto_select_cb ==
          (_func_int_SSL_ptr_uint8_t_ptr_ptr_uint8_t_ptr_uint8_t_ptr_uint_void_ptr *)0x0) {
        __assert_fail("ssl->ctx->next_proto_select_cb != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x485,
                      "bool bssl::ext_npn_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
      }
      bVar3 = Array<unsigned_char>::empty(&ssl_00->s3->alpn_selected);
      if (bVar3) {
        puVar7 = CBS_data(contents);
        proto.len = CBS_len(contents);
        do {
          sVar8 = CBS_len(contents);
          if (sVar8 == 0) {
            psVar6 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl_00->ctx);
            sVar8 = proto.len;
            p_Var1 = psVar6->next_proto_select_cb;
            psVar6 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl_00->ctx);
            iVar5 = (*p_Var1)(ssl_00,&stack0xffffffffffffffa8,&local_59,puVar7,(uint)sVar8,
                              psVar6->next_proto_select_cb_arg);
            local_81 = 1;
            if (iVar5 == 0) {
              pSVar2 = ssl_00->s3;
              Span<unsigned_char>::Span(&local_80,puStack_58,(ulong)local_59);
              Span<unsigned_char_const>::
              Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                        ((Span<unsigned_char_const> *)&local_70,&local_80);
              bVar3 = Array<unsigned_char>::CopyFrom(&pSVar2->next_proto_negotiated,local_70);
              local_81 = bVar3 ^ 0xff;
            }
            if ((local_81 & 1) == 0) {
              *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xffff7fff | 0x8000;
              return true;
            }
            *out_alert = 'P';
            return false;
          }
          iVar5 = CBS_get_u8_length_prefixed(contents,(CBS *)&selected);
        } while ((iVar5 != 0) && (sVar8 = CBS_len((CBS *)&selected), sVar8 != 0));
        hs_local._7_1_ = false;
      }
      else {
        *out_alert = '/';
        ERR_put_error(0x10,0,0xaa,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x48a);
        hs_local._7_1_ = false;
      }
    }
    else {
      hs_local._7_1_ = false;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_npn_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL) {
    return true;
  }

  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return false;
  }

  // If any of these are false then we should never have sent the NPN
  // extension in the ClientHello and thus this function should never have been
  // called.
  assert(!ssl->s3->initial_handshake_complete);
  assert(!SSL_is_dtls(ssl));
  assert(ssl->ctx->next_proto_select_cb != NULL);

  if (!ssl->s3->alpn_selected.empty()) {
    // NPN and ALPN may not be negotiated in the same connection.
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    OPENSSL_PUT_ERROR(SSL, SSL_R_NEGOTIATED_BOTH_NPN_AND_ALPN);
    return false;
  }

  const uint8_t *const orig_contents = CBS_data(contents);
  const size_t orig_len = CBS_len(contents);

  while (CBS_len(contents) != 0) {
    CBS proto;
    if (!CBS_get_u8_length_prefixed(contents, &proto) ||  //
        CBS_len(&proto) == 0) {
      return false;
    }
  }

  // |orig_len| fits in |unsigned| because TLS extensions use 16-bit lengths.
  uint8_t *selected;
  uint8_t selected_len;
  if (ssl->ctx->next_proto_select_cb(
          ssl, &selected, &selected_len, orig_contents,
          static_cast<unsigned>(orig_len),
          ssl->ctx->next_proto_select_cb_arg) != SSL_TLSEXT_ERR_OK ||
      !ssl->s3->next_proto_negotiated.CopyFrom(Span(selected, selected_len))) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  hs->next_proto_neg_seen = true;
  return true;
}